

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<bool>
          (Attribute *this,double t,bool *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  undefined1 local_3c [2];
  optional<bool> local_3a;
  optional<bool> v;
  TimeSampleInterpolationType tinterp_local;
  bool *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (bool *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<bool>((PrimVar *)local_3c);
      nonstd::optional_lite::optional<bool>::optional<bool,_0>
                ((optional<bool> *)(local_3c + 2),(optional<bool> *)local_3c);
      nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)local_3c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(local_3c + 2));
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(local_3c + 2));
        *dst = (bool)(*pvVar2 & 1);
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)(local_3c + 2));
      if (bVar1) goto LAB_007ab4a6;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ = primvar::PrimVar::get_interpolated_value<bool>(&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<bool>(this,dst);
    }
  }
LAB_007ab4a6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }